

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnInitExprRefNull(BinaryReaderIR *this,Index index)

{
  char *__s;
  Offset OVar1;
  ExprList *pEVar2;
  Expr *pEVar3;
  Expr *node_p;
  size_t sVar4;
  Expr *pEVar5;
  ExprList *pEVar6;
  
  __s = this->filename_;
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  sVar4 = strlen(__s);
  pEVar2 = this->current_init_expr_;
  pEVar5 = (Expr *)operator_new(0x40);
  (pEVar5->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  (pEVar5->loc).filename.data_ = __s;
  (pEVar5->loc).filename.size_ = sVar4;
  (pEVar5->loc).field_1.field_1.offset = OVar1;
  (pEVar5->loc).field_1.field_0.last_column = 0;
  pEVar5->type_ = RefNull;
  pEVar5->_vptr_Expr = (_func_int **)&PTR__Expr_00194690;
  pEVar3 = pEVar2->last_;
  pEVar6 = pEVar2;
  if (pEVar3 != (Expr *)0x0) {
    (pEVar5->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar3;
    pEVar6 = (ExprList *)&pEVar3->super_intrusive_list_base<wabt::Expr>;
  }
  pEVar6->first_ = pEVar5;
  pEVar2->last_ = pEVar5;
  pEVar2->size_ = pEVar2->size_ + 1;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderIR::OnInitExprRefNull(Index index) {
  Location loc = GetLocation();
  current_init_expr_->push_back(MakeUnique<RefNullExpr>(loc));
  return Result::Ok;
}